

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_graph.cpp
# Opt level: O3

void __thiscall test_adjacency_graph_back_Test::TestBody(test_adjacency_graph_back_Test *this)

{
  pointer *__ptr;
  char *pcVar1;
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> edge_graph;
  span<unsigned_long,_18446744073709551615UL> sVar2;
  span<unsigned_long,_18446744073709551615UL> sVar3;
  Adjacency_Graph<true> graph;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  AssertHelper local_80;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  Adjacency_Graph<false> local_38 [48];
  
  local_78 = (undefined1  [8])0x0;
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_68 = 2;
  local_60 = 1;
  local_58 = 2;
  local_50 = 3;
  local_48 = 3;
  local_40 = 0;
  edge_graph._M_len = 4;
  edge_graph._M_array = (iterator)local_78;
  Disa::Adjacency_Graph<false>::Adjacency_Graph(local_38,edge_graph);
  sVar2 = Disa::Adjacency_Graph<false>::back(local_38);
  local_88._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       sVar2._M_extent._M_extent_value;
  local_80.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_78,"graph.back().size()","2",(unsigned_long *)&local_88,
             (int *)&local_80);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x8d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  sVar2 = Disa::Adjacency_Graph<false>::back(local_38);
  local_88._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  sVar3 = Disa::Adjacency_Graph<false>::operator[](local_38,(size_t *)&local_88);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_78,"graph.back()[0]","graph[3][0]",sVar2._M_ptr,sVar3._M_ptr);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x8e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  sVar2 = Disa::Adjacency_Graph<false>::back(local_38);
  local_88._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  sVar3 = Disa::Adjacency_Graph<false>::operator[](local_38,(size_t *)&local_88);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_78,"graph.back()[1]","graph[3][1]",sVar2._M_ptr + 1,sVar3._M_ptr + 1)
  ;
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x8f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  Disa::Adjacency_Graph<false>::~Adjacency_Graph(local_38);
  return;
}

Assistant:

TEST(test_adjacency_graph, back) {
  Adjacency_Graph<false> graph({{0, 1}, {2, 1}, {2, 3}, {3, 0}});
  EXPECT_EQ(graph.back().size(), 2);
  EXPECT_EQ(graph.back()[0], graph[3][0]);
  EXPECT_EQ(graph.back()[1], graph[3][1]);
}